

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::CopyTexSubImage2D::exec(CopyTexSubImage2D *this,Thread *t)

{
  deUint32 dVar1;
  Thread *pTVar2;
  MessageBuilder *pMVar3;
  undefined1 local_1c0 [400];
  
  pTVar2 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pTVar2 != (Thread *)0x0) {
    local_1c0._0_8_ = pTVar2;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1c0 + 8));
    std::operator<<((ostream *)(local_1c0 + 0x18),"Begin -- glBindTexture(GL_TEXTURE_2D, ");
    pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1c0,&((this->m_texture).m_ptr)->texture);
    std::operator<<((ostream *)&pMVar3->field_0x18,")");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
    (**(code **)(*(long *)&pTVar2[1].super_Thread.m_attribs + 0xb8))
              (0xde1,((this->m_texture).m_ptr)->texture);
    dVar1 = (**(code **)(*(long *)&pTVar2[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar1,"bindTexture(GL_TEXTURE_2D, m_texture->texture)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x473);
    local_1c0._0_8_ = pTVar2;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1c0 + 8));
    std::operator<<((ostream *)(local_1c0 + 0x18),"End -- glBindTexture()");
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
    local_1c0._0_8_ = pTVar2;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1c0 + 8));
    std::operator<<((ostream *)(local_1c0 + 0x18),"Begin -- glCopyTexSubImage2D(GL_TEXTURE_2D, ");
    pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<((MessageBuilder *)local_1c0,&this->m_level)
    ;
    std::operator<<((ostream *)&pMVar3->field_0x18,", ");
    pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,&this->m_xoffset);
    std::operator<<((ostream *)&pMVar3->field_0x18,", ");
    pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,&this->m_yoffset);
    std::operator<<((ostream *)&pMVar3->field_0x18,", ");
    pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,&this->m_x);
    std::operator<<((ostream *)&pMVar3->field_0x18,", ");
    pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,&this->m_y);
    std::operator<<((ostream *)&pMVar3->field_0x18,", ");
    pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,&this->m_width);
    std::operator<<((ostream *)&pMVar3->field_0x18,", ");
    pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,&this->m_height);
    std::operator<<((ostream *)&pMVar3->field_0x18,")");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
    (**(code **)(*(long *)&pTVar2[1].super_Thread.m_attribs + 0x360))
              (0xde1,this->m_level,this->m_xoffset,this->m_yoffset,this->m_x,this->m_y,this->m_width
               ,this->m_height);
    dVar1 = (**(code **)(*(long *)&pTVar2[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar1,
                    "copyTexSubImage2D(GL_TEXTURE_2D, m_level, m_xoffset, m_yoffset, m_x, m_y, m_width, m_height)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x477);
    local_1c0._0_8_ = pTVar2;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1c0 + 8));
    std::operator<<((ostream *)(local_1c0 + 0x18),"End -- glCopyTexSubImage2D()");
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
    local_1c0._0_8_ = pTVar2;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1c0 + 8));
    std::operator<<((ostream *)(local_1c0 + 0x18),"Begin -- glBindTexture(GL_TEXTURE_2D, 0)");
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
    (**(code **)(*(long *)&pTVar2[1].super_Thread.m_attribs + 0xb8))(0xde1,0);
    dVar1 = (**(code **)(*(long *)&pTVar2[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar1,"bindTexture(GL_TEXTURE_2D, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x47b);
    local_1c0._0_8_ = pTVar2;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1c0 + 8));
    std::operator<<((ostream *)(local_1c0 + 0x18),"End -- glBindTexture()");
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void CopyTexSubImage2D::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	thread.newMessage() << "Begin -- glBindTexture(GL_TEXTURE_2D, " << m_texture->texture << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindTexture(GL_TEXTURE_2D, m_texture->texture));
	thread.newMessage() << "End -- glBindTexture()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glCopyTexSubImage2D(GL_TEXTURE_2D, " << m_level << ", " << m_xoffset << ", " << m_yoffset << ", " << m_x << ", " << m_y << ", " << m_width << ", " << m_height << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, copyTexSubImage2D(GL_TEXTURE_2D, m_level, m_xoffset, m_yoffset, m_x, m_y, m_width, m_height));
	thread.newMessage() << "End -- glCopyTexSubImage2D()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glBindTexture(GL_TEXTURE_2D, 0)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindTexture(GL_TEXTURE_2D, 0));
	thread.newMessage() << "End -- glBindTexture()" << tcu::ThreadUtil::Message::End;
}